

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void clask::sort_handlers(node *n)

{
  node *pnVar1;
  _node *v;
  node *n_00;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<clask::_node*,std::vector<clask::_node,std::allocator<clask::_node>>>,__gnu_cxx::__ops::_Iter_comp_iter<clask::sort_handlers(clask::_node&)::_lambda(clask::_node_const&,clask::_node_const&)_1_>>
            ((n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_start,
             (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pnVar1 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (n_00 = (n->children).super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
              super__Vector_impl_data._M_start; n_00 != pnVar1; n_00 = n_00 + 1) {
    sort_handlers(n_00);
  }
  return;
}

Assistant:

inline void sort_handlers(node& n) {
  std::sort(
    n.children.begin(),
    n.children.end(),
    [](const node& x, const node& y){ return x.name > y.name; }
  );
  for (auto& v : n.children) {
    sort_handlers(v);
  }
}